

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O3

bool tinyusdz::srgb_f32_to_linear_f32
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,size_t channel_stride,vector<float,_std::allocator<float>_> *out_img,
               float scale_factor,float bias,float alpha_scale_factor,float alpha_bias,string *err)

{
  ostringstream *poVar1;
  pointer pfVar2;
  pointer pfVar3;
  ostream *poVar4;
  long lVar5;
  pointer pcVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  size_t dest_size;
  ostringstream ss_e;
  string local_250;
  size_t local_230;
  undefined4 local_228;
  float local_224;
  long local_220;
  size_t local_218;
  size_t local_210;
  long local_208;
  long local_200;
  size_t local_1f8;
  size_t local_1f0;
  undefined1 local_1e8 [8];
  undefined8 *local_1e0;
  undefined8 local_1d0 [2];
  undefined1 local_1c0 [136];
  ios_base local_138 [264];
  
  local_230 = channels;
  local_224 = alpha_bias;
  local_1c0._0_8_ = channel_stride;
  local_1c0._8_8_ = channels;
  if (width == 0) {
    poVar1 = (ostringstream *)(local_1c0 + 0x18);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"srgb_f32_to_linear_f32",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(poVar1,0x1da);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar8 = "width is zero.";
    lVar5 = 0xe;
LAB_0044bc40:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1c0 + 0x18),pcVar8,lVar5)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1c0 + 0x18),"\n",1);
    if (err == (string *)0x0) goto LAB_0044bc9f;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_250._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) goto LAB_0044bc9f;
  }
  else {
    if (height == 0) {
      poVar1 = (ostringstream *)(local_1c0 + 0x18);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"srgb_f32_to_linear_f32",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(poVar1,0x1de);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar8 = "height is zero.";
      lVar5 = 0xf;
      goto LAB_0044bc40;
    }
    if (channels == 0) {
      poVar1 = (ostringstream *)(local_1c0 + 0x18);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"srgb_f32_to_linear_f32",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(poVar1,0x1e2);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar8 = "channels is zero.";
      lVar5 = 0x11;
      goto LAB_0044bc40;
    }
    if (out_img == (vector<float,_std::allocator<float>_> *)0x0) {
      poVar1 = (ostringstream *)(local_1c0 + 0x18);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"srgb_f32_to_linear_f32",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(poVar1,0x1e6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar8 = "`out_img` is nullptr.";
      lVar5 = 0x15;
      goto LAB_0044bc40;
    }
    sVar9 = channels;
    if ((channel_stride == 0) || (sVar9 = channel_stride, channels <= channel_stride)) {
      local_1e8 = (undefined1  [8])(height * width * sVar9);
      lVar5 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      pcVar6 = (pointer)(lVar5 >> 2);
      bVar11 = (long)local_1e8 - (long)pcVar6 == 0;
      local_228 = (undefined4)CONCAT71((int7)(lVar5 >> 10),(ulong)local_1e8 < pcVar6 || bVar11);
      if ((ulong)local_1e8 < pcVar6 || bVar11) {
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,(size_type)local_1e8);
        local_220 = sVar9 * width * 4;
        local_200 = sVar9 * 4;
        lVar5 = 0;
        local_210 = 0;
        local_218 = height;
        local_1f8 = width;
        do {
          local_1f0 = 0;
          sVar10 = local_230;
          local_208 = lVar5;
          lVar7 = lVar5;
          do {
            do {
              fVar12 = *(float *)((long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                        _M_impl.super__Vector_impl_data._M_start + lVar5) *
                       scale_factor + bias;
              fVar13 = 0.0;
              if ((0.0 < fVar12) && (fVar13 = 1.0, fVar12 < 1.0)) {
                if (0.04045 <= fVar12) {
                  fVar13 = powf((fVar12 + 0.055) / 1.055,2.4);
                }
                else {
                  fVar13 = fVar12 / 12.92;
                }
              }
              *(float *)((long)(out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5) = fVar13;
              lVar5 = lVar5 + 4;
              sVar10 = sVar10 - 1;
            } while (sVar10 != 0);
            if (local_230 < sVar9) {
              pfVar2 = (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pfVar3 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              sVar10 = local_230;
              do {
                *(float *)((long)pfVar2 + sVar10 * 4 + lVar7) =
                     *(float *)((long)pfVar3 + sVar10 * 4 + lVar7) * alpha_scale_factor + local_224;
                sVar10 = sVar10 + 1;
              } while (sVar9 != sVar10);
            }
            local_1f0 = local_1f0 + 1;
            lVar5 = lVar7 + local_200;
            sVar10 = local_230;
            lVar7 = lVar5;
          } while (local_1f0 != local_1f8);
          local_210 = local_210 + 1;
          lVar5 = local_208 + local_220;
        } while (local_210 != local_218);
      }
      else {
        poVar1 = (ostringstream *)(local_1c0 + 0x18);
        ::std::__cxx11::ostringstream::ostringstream(poVar1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                   ,0x54);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"srgb_f32_to_linear_f32",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(poVar1,499);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        local_1e0 = local_1d0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,
                   "Insufficient input buffer size. must be the same or larger than {} but has {}",
                   "");
        local_1c0._16_8_ =
             (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
        fmt::format<unsigned_long,unsigned_long>
                  (&local_250,(fmt *)&local_1e0,(string *)local_1e8,
                   (unsigned_long *)(local_1c0 + 0x10),(unsigned_long *)channel_stride);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,local_250._M_dataplus._M_p,local_250._M_string_length)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_250._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c0 + 0x18));
        ::std::ios_base::~ios_base(local_138);
      }
      return (bool)(char)local_228;
    }
    poVar1 = (ostringstream *)(local_1c0 + 0x18);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"srgb_f32_to_linear_f32",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(poVar1,0x1ed);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    local_1e0 = local_1d0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"channel_stride {} is smaller than input channels {}","");
    fmt::format<unsigned_long,unsigned_long>
              (&local_250,(fmt *)&local_1e0,(string *)local_1c0,(unsigned_long *)(local_1c0 + 8),
               (unsigned_long *)channel_stride);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_250._M_dataplus._M_p,local_250._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    if (err == (string *)0x0) goto LAB_0044bc9f;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_250._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) goto LAB_0044bc9f;
  }
  operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
LAB_0044bc9f:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c0 + 0x18));
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool srgb_f32_to_linear_f32(const std::vector<float> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<float> *out_img, const float scale_factor, const float bias, const float alpha_scale_factor, const float alpha_bias, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // assume input is in [0.0, 1.0]
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * scale_factor + bias;
        (*out_img)[idx] = SrgbTransform::srgbToLinear(f);
      }

      // remainder(usually alpha channel)
      // Apply linear conversion.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * alpha_scale_factor + alpha_bias;
        (*out_img)[idx] = f;
      }
    }
  }

  return true;
}